

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_allocate_node_records
          (Impl *this,SPIRVModule *param_1,bool per_thread)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  Op returnType;
  Id IVar1;
  MemorySemanticsMask MVar2;
  char *name;
  Function *this_00;
  pointer pIVar3;
  __uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true> this_01;
  Block *pBVar4;
  Block *this_02;
  Block *this_03;
  pointer pIVar5;
  size_t sVar6;
  Block *local_4b8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_4a8;
  undefined4 local_49c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_498;
  __single_object barrier_op_1;
  Id local_484;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_480;
  __single_object load_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_470;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_468;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_460;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_458;
  undefined4 local_450;
  Id local_44c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_448;
  __single_object add_op_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_438;
  __single_object mul_op_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_428;
  __single_object broadcast_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_418;
  __single_object phi_node;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_408;
  __single_object counts_offsets;
  Id return_value;
  undefined4 local_3ec;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3e8;
  __single_object barrier_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3d0;
  __single_object store_inst;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3c0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3b8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3b0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3a8;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_3a0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_398;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_390;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_388;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_380;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_378;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_370;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_368;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_360;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_358;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_350;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_348;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_340;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_338;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_330;
  undefined4 local_324;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_320;
  __single_object store_payload_inst_plus_1;
  Op local_310;
  Id local_30c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_308;
  __single_object chain_payload_op_plus_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_2f8;
  __single_object store_payload_inst;
  Op local_2e8;
  Id local_2e4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_2e0;
  __single_object chain_payload_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_2d0;
  __single_object payload_add_atomic_op_plus_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_2c0;
  __single_object payload_add_atomic_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_2b0;
  __single_object fused_mul2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_2a0;
  __single_object fused_atomic_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_290;
  __single_object or_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_280;
  __single_object count_minus_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_270;
  __single_object shift_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_260;
  __single_object atomic_total_op;
  Op local_250;
  Id local_24c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_248;
  __single_object chain_node_total_op;
  Id node_index;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_230;
  __single_object payload_total_atomic_op;
  Op local_220;
  Id local_21c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_218;
  __single_object chain_fused_total_op;
  Op local_208;
  Id local_204;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_200;
  __single_object chain_payload_total_op;
  Op local_1f0;
  Id local_1ec;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_1e8;
  __single_object cast_op;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1c0;
  Id local_1a8;
  Id local_1a4;
  Id struct_type_id;
  Id uint_array_type;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_198;
  __single_object and_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_188;
  __single_object add_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_178;
  __single_object mul_op;
  Id payload_offset_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_160;
  undefined4 local_158;
  Id local_154;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_150;
  __single_object is_first_lane_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_140;
  __single_object load_local_index;
  Id local_invocation_index;
  undefined4 local_128;
  Id local_124;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_120;
  __single_object is_first_lane;
  Id is_first_lane_id;
  Id shared_id;
  Block *merge_block;
  Block *body_block;
  Block *reconverge_block;
  Id local_ec;
  undefined4 local_e8;
  Id return_early_cond_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_e0;
  __single_object check_empty;
  Block *return_block;
  undefined4 local_c8;
  Id local_c4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_c0;
  __single_object counts_total;
  Id phi_undefined_id;
  Id total_count_id;
  allocator_type local_95;
  Id local_94;
  Op local_90;
  Op local_8c;
  Op local_88;
  Op local_84;
  iterator local_80;
  undefined8 local_78;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_70;
  Function *local_58;
  Function *func;
  Op local_48;
  Id uint64_type;
  Id uint_type;
  Id bool_type;
  Block *entry;
  Block *current_build_point;
  Id *call_id;
  SPIRVModule *pSStack_20;
  bool per_thread_local;
  SPIRVModule *param_1_local;
  Impl *this_local;
  
  if (per_thread) {
    local_4b8 = (Block *)&this->allocate_thread_node_records_call_id;
  }
  else {
    local_4b8 = (Block *)&this->allocate_group_node_records_call_id;
  }
  current_build_point = local_4b8;
  if (*(Id *)&local_4b8->_vptr_Block == 0) {
    call_id._7_1_ = per_thread;
    pSStack_20 = param_1;
    param_1_local = (SPIRVModule *)this;
    entry = spv::Builder::getBuildPoint(&this->builder);
    _uint_type = (Block *)0x0;
    uint64_type = spv::Builder::makeBoolType(&this->builder);
    local_48 = spv::Builder::makeUintType(&this->builder,0x20);
    local_94 = spv::Builder::makeUintType(&this->builder,0x40);
    returnType = local_48;
    name = "AllocateGroupNodeRecords";
    if ((call_id._7_1_ & 1) != 0) {
      name = "AllocateThreadNodeRecords";
    }
    local_90 = local_48;
    local_8c = local_48;
    local_88 = local_48;
    local_84 = local_48;
    local_80 = &local_94;
    local_78 = 5;
    __l_00._M_len = 5;
    __l_00._M_array = local_80;
    func._4_4_ = local_94;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_70,__l_00,&local_95);
    memset(&phi_undefined_id,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&phi_undefined_id);
    this_00 = spv::Builder::makeFunctionEntry
                        (&this->builder,DecorationMax,returnType,name,&local_70,
                         (Vector<dxil_spv::Vector<Decoration>_> *)&phi_undefined_id,
                         (Block **)&uint_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&phi_undefined_id);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_70);
    local_58 = this_00;
    IVar1 = spv::Function::getParamId(this_00,0);
    spv::Builder::addName(&this->builder,IVar1,"AtomicCountersBDA");
    IVar1 = spv::Function::getParamId(local_58,1);
    spv::Builder::addName(&this->builder,IVar1,"NodeMetadataIndex");
    IVar1 = spv::Function::getParamId(local_58,2);
    spv::Builder::addName(&this->builder,IVar1,"Count");
    IVar1 = spv::Function::getParamId(local_58,3);
    spv::Builder::addName(&this->builder,IVar1,"Stride");
    IVar1 = spv::Function::getParamId(local_58,4);
    spv::Builder::addName(&this->builder,IVar1,"AllocationOffset");
    counts_total._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0;
    if ((call_id._7_1_ & 1) == 0) {
      sVar6 = 2;
      counts_total._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Function::getParamId(local_58,2);
    }
    else {
      spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
      spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformArithmetic);
      local_c4 = spv::Builder::getUniqueId(&this->builder);
      local_c8 = 0x15d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_c0,&local_c4,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_c0);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_c0);
      spv::Instruction::addImmediateOperand(pIVar3,0);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_c0);
      IVar1 = spv::Function::getParamId(local_58,2);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_c0);
      counts_total._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Instruction::getResultId(pIVar3);
      pBVar4 = _uint_type;
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &return_block,&local_c0);
      add_instruction(this,pBVar4,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &return_block);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &return_block);
      sVar6 = (size_t)local_48;
      counts_total._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
           spv::Builder::createUndefined(&this->builder,local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_c0);
    }
    this_01.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
         spv::Block::operator_new((Block *)0x78,sVar6);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block((Block *)this_01.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar1,
                      local_58);
    check_empty._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
    ._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         this_01.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
         _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    return_early_cond_id = spv::Builder::getUniqueId(&this->builder);
    local_e8 = 0xaa;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_e0,&return_early_cond_id,&uint64_type);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_e0);
    spv::Instruction::addIdOperand
              (pIVar3,counts_total._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_e0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_e0);
    local_ec = spv::Instruction::getResultId(pIVar3);
    pBVar4 = _uint_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &reconverge_block,&local_e0);
    add_instruction(this,pBVar4,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &reconverge_block);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &reconverge_block);
    pBVar4 = (Block *)spv::Block::operator_new((Block *)0x78,(size_t)pBVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(pBVar4,IVar1,local_58);
    spv::Builder::setBuildPoint(&this->builder,_uint_type);
    spv::Builder::createSelectionMerge(&this->builder,pBVar4,0);
    spv::Builder::createConditionalBranch
              (&this->builder,local_ec,
               (Block *)check_empty._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,pBVar4);
    spv::Builder::setBuildPoint
              (&this->builder,
               (Block *)check_empty._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    sVar6 = 0;
    spv::Builder::makeReturn(&this->builder,false,IVar1);
    this_02 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    sVar6 = (size_t)IVar1;
    spv::Block::Block(this_02,IVar1,local_58);
    this_03 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(this_03,IVar1,local_58);
    is_first_lane._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0;
    if ((call_id._7_1_ & 1) == 0) {
      is_first_lane._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           create_variable(this,StorageClassWorkgroup,local_48,"AllocateGroupNodeRecordsShared");
    }
    if ((call_id._7_1_ & 1) == 0) {
      load_local_index._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           get_builtin_shader_input(this,BuiltInLocalInvocationIndex);
      is_first_lane_1._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      is_first_lane_1._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x3d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_140,
                 (uint *)((long)&is_first_lane_1._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_140);
      spv::Instruction::addIdOperand
                (pIVar3,load_local_index._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      local_154 = spv::Builder::getUniqueId(&this->builder);
      local_158 = 0xaa;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_150,&local_154,&uint64_type);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_150);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_140);
      IVar1 = spv::Instruction::getResultId(pIVar5);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_150);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_150);
      is_first_lane._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
           spv::Instruction::getResultId(pIVar3);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_160,&local_140);
      add_instruction(this,pBVar4,&local_160);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_160);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffe98,&local_150);
      add_instruction(this,pBVar4,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &stack0xfffffffffffffe98);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffe98);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_150);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_140);
    }
    else {
      local_124 = spv::Builder::getUniqueId(&this->builder);
      local_128 = 0x14d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_120,&local_124,&uint64_type);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_120);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_120);
      is_first_lane._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
           spv::Instruction::getResultId(pIVar3);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffed0,&local_120);
      add_instruction(this,pBVar4,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &stack0xfffffffffffffed0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffed0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_120);
    }
    spv::Builder::setBuildPoint(&this->builder,pBVar4);
    spv::Builder::createSelectionMerge(&this->builder,this_03,0);
    spv::Builder::createConditionalBranch
              (&this->builder,
               (Id)is_first_lane._M_t.
                   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,this_02,this_03);
    spv::Builder::setBuildPoint(&this->builder,this_02);
    add_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    add_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x84;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_178,
               (uint *)((long)&add_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    spv::Instruction::addIdOperand
              (pIVar3,counts_total._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    IVar1 = spv::Function::getParamId(local_58,3);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    and_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    and_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_188,
               (uint *)((long)&and_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_188);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_178);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_188);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0xf,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    uint_array_type = spv::Builder::getUniqueId(&this->builder);
    struct_type_id = 199;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_198,&uint_array_type,&local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_198);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_188);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_198);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0xfffffff0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_1a4 = spv::Builder::makeRuntimeArray(&this->builder,local_48);
    spv::Builder::addDecoration(&this->builder,local_1a4,DecorationArrayStride,4);
    cast_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = local_48;
    __l._M_len = 3;
    __l._M_array = (iterator)
                   ((long)&cast_op._M_t.
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_1c0,__l,
               (allocator_type *)
               ((long)&cast_op._M_t.
                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 3));
    IVar1 = spv::Builder::makeStructType(&this->builder,&local_1c0,"NodeAtomics");
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_1c0);
    local_1a8 = IVar1;
    spv::Builder::addDecoration(&this->builder,IVar1,DecorationBlock,-1);
    spv::Builder::addMemberName(&this->builder,local_1a8,0,"payloadCount");
    spv::Builder::addMemberName(&this->builder,local_1a8,1,"fusedCount");
    spv::Builder::addMemberName(&this->builder,local_1a8,2,"perNodeTotal");
    spv::Builder::addMemberDecoration(&this->builder,local_1a8,0,DecorationOffset,0);
    spv::Builder::addMemberDecoration(&this->builder,local_1a8,1,DecorationOffset,4);
    spv::Builder::addMemberDecoration(&this->builder,local_1a8,2,DecorationOffset,8);
    local_1ec = spv::Builder::getUniqueId(&this->builder);
    local_1f0 = spv::Builder::makePointer
                          (&this->builder,StorageClassPhysicalStorageBuffer,local_1a8);
    chain_payload_total_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x7c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_1e8,&local_1ec,&local_1f0);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1e8);
    IVar1 = spv::Function::getParamId(local_58,0);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_204 = spv::Builder::getUniqueId(&this->builder);
    local_208 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_48)
    ;
    chain_fused_total_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_200,&local_204,&local_208);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1e8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_21c = spv::Builder::getUniqueId(&this->builder);
    local_220 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_48)
    ;
    payload_total_atomic_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_218,&local_21c,&local_220);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_218);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1e8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_218);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    node_index = spv::Builder::getUniqueId(&this->builder);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_230,&node_index,&local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_230);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_200);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_230);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_230);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_230);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_198);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    chain_node_total_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Function::getParamId(local_58,1);
    local_24c = spv::Builder::getUniqueId(&this->builder);
    local_250 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_48)
    ;
    atomic_total_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_248,&local_24c,&local_250);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_248);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1e8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_248);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_248);
    spv::Instruction::addIdOperand
              (pIVar3,chain_node_total_op._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    shift_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    shift_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xea;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_260,
               (uint *)((long)&shift_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_260);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_248);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_260);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_260);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_260);
    spv::Instruction::addIdOperand
              (pIVar3,counts_total._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    count_minus_1._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    count_minus_1._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc4;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_270,
               (uint *)((long)&count_minus_1._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_270);
    spv::Instruction::addIdOperand
              (pIVar3,chain_node_total_op._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_270);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,8,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    or_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    or_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x82;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_280,
               (uint *)((long)&or_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_280);
    spv::Instruction::addIdOperand
              (pIVar3,counts_total._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_280);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    fused_atomic_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    fused_atomic_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xc5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_290,
               (uint *)((long)&fused_atomic_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_290);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_270);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_290);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_280);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    fused_mul2._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    fused_mul2._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xe8;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_2a0,
               (uint *)((long)&fused_mul2._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2a0);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_218);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2a0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2a0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    payload_add_atomic_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    payload_add_atomic_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x84;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_2b0,
               (uint *)((long)&payload_add_atomic_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2b0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2b0);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2a0);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    payload_add_atomic_op_plus_1._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    payload_add_atomic_op_plus_1._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_2c0,
               (uint *)((long)&payload_add_atomic_op_plus_1._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2c0);
    IVar1 = spv::Function::getParamId(local_58,4);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2c0);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2b0);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    chain_payload_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    chain_payload_op._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_2d0,
               (uint *)((long)&chain_payload_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_48);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2d0);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2c0);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2d0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_2e4 = spv::Builder::getUniqueId(&this->builder);
    local_2e8 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_48)
    ;
    store_payload_inst._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_2e0,&local_2e4,&local_2e8);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2e0);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1e8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2e0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2e0);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2c0);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    chain_payload_op_plus_1._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x3e;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_2f8);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2f8);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2e0);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2f8);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_290);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2f8);
    spv::Instruction::addImmediateOperand(pIVar3,2);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2f8);
    spv::Instruction::addImmediateOperand(pIVar3,8);
    local_30c = spv::Builder::getUniqueId(&this->builder);
    local_310 = spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,local_48)
    ;
    store_payload_inst_plus_1._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0x42;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_308,&local_30c,&local_310);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_308);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_1e8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_308);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_308);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_2d0);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    local_324 = 0x3e;
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_320);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_320);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_308);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_320);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_230);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_320);
    spv::Instruction::addImmediateOperand(pIVar3,2);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_320);
    spv::Instruction::addImmediateOperand(pIVar3,4);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_230);
    mul_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Instruction::getResultId(pIVar3);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_330,&local_178);
    add_instruction(this,this_02,&local_330);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_330);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_338,&local_188);
    add_instruction(this,this_02,&local_338);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_338);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_340,&local_198);
    add_instruction(this,this_02,&local_340);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_340);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_348,&local_1e8);
    add_instruction(this,this_02,&local_348);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_348);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_350,&local_200);
    add_instruction(this,this_02,&local_350);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_350);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_358,&local_218);
    add_instruction(this,this_02,&local_358);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_358);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_360,&local_230);
    add_instruction(this,this_02,&local_360);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_360);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_368,&local_248);
    add_instruction(this,this_02,&local_368);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_368);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_370,&local_270);
    add_instruction(this,this_02,&local_370);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_370);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_378,&local_280);
    add_instruction(this,this_02,&local_378);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_378);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_380,&local_290);
    add_instruction(this,this_02,&local_380);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_380);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_388,&local_2a0);
    add_instruction(this,this_02,&local_388);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_388);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_390,&local_2b0);
    add_instruction(this,this_02,&local_390);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_390);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_398,&local_260);
    add_instruction(this,this_02,&local_398);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_398);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_3a0,&local_2c0);
    add_instruction(this,this_02,&local_3a0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_3a0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_3a8,&local_2d0);
    add_instruction(this,this_02,&local_3a8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_3a8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_3b0,&local_2e0);
    add_instruction(this,this_02,&local_3b0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_3b0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_3b8,&local_2f8);
    add_instruction(this,this_02,&local_3b8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_3b8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_3c0,&local_308);
    add_instruction(this,this_02,&local_3c0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_3c0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&store_inst,&local_320);
    add_instruction(this,this_02,&store_inst);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&store_inst);
    if ((call_id._7_1_ & 1) == 0) {
      std::make_unique<spv::Instruction,spv::Op>((Op *)&local_3d0);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_3d0);
      spv::Instruction::addIdOperand
                (pIVar3,is_first_lane._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_3d0);
      spv::Instruction::addIdOperand
                (pIVar3,mul_op._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&barrier_op,&local_3d0);
      add_instruction(this,this_02,&barrier_op);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&barrier_op);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_3d0);
    }
    spv::Builder::createBranch(&this->builder,this_03);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_320);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_308);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_2f8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_2e0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_2d0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_2c0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_2b0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_2a0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_290);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_280);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_270);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_260);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_248);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_230);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_218);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_200);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_1e8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_198);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_188);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_178);
    spv::Builder::setBuildPoint(&this->builder,this_03);
    if ((call_id._7_1_ & 1) == 0) {
      local_3ec = 0xe0;
      std::make_unique<spv::Instruction,spv::Op>((Op *)&local_3e8);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_3e8);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_3e8);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_3e8);
      MVar2 = spv::operator|(MemorySemanticsAcquireReleaseMask,MemorySemanticsWorkgroupMemoryMask);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,MVar2,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffc08,&local_3e8);
      add_instruction(this,this_03,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &stack0xfffffffffffffc08);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xfffffffffffffc08);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_3e8);
    }
    if ((call_id._7_1_ & 1) == 0) {
      local_484 = spv::Builder::getUniqueId(&this->builder);
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_480,&local_484,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_480);
      spv::Instruction::addIdOperand
                (pIVar3,is_first_lane._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_480);
      counts_offsets._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Instruction::getResultId(pIVar3);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&barrier_op_1,&local_480);
      add_instruction(this,this_03,&barrier_op_1);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&barrier_op_1);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_480);
    }
    else {
      phi_node._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      phi_node._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x15d;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_408,
                 (uint *)((long)&phi_node._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_408);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_408);
      spv::Instruction::addImmediateOperand(pIVar3,2);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_408);
      IVar1 = spv::Function::getParamId(local_58,2);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      broadcast_op._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      broadcast_op._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xf5;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_418,
                 (uint *)((long)&broadcast_op._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_418);
      spv::Instruction::addIdOperand
                (pIVar3,mul_op._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_418);
      IVar1 = spv::Block::getId(this_02);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_418);
      spv::Instruction::addIdOperand
                (pIVar3,(Id)counts_total._M_t.
                            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_418);
      IVar1 = spv::Block::getId(pBVar4);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      mul_op_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      mul_op_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x152;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_428,
                 (uint *)((long)&mul_op_1._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_428);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_428);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_418);
      IVar1 = spv::Instruction::getResultId(pIVar5);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      add_op_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Builder::getUniqueId(&this->builder);
      add_op_1._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x84;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_438,
                 (uint *)((long)&add_op_1._M_t.
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                 .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4)
                 ,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_438);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_408);
      IVar1 = spv::Instruction::getResultId(pIVar5);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_438);
      IVar1 = spv::Function::getParamId(local_58,3);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      local_44c = spv::Builder::getUniqueId(&this->builder);
      local_450 = 0x80;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_448,&local_44c,&local_48);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_448);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_428);
      IVar1 = spv::Instruction::getResultId(pIVar5);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_448);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_438);
      IVar1 = spv::Instruction::getResultId(pIVar5);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_448);
      counts_offsets._M_t.
      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
           spv::Instruction::getResultId(pIVar3);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_458,&local_418);
      add_instruction(this,this_03,&local_458);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_458);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_460,&local_428);
      add_instruction(this,this_03,&local_460);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_460);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_468,&local_408);
      add_instruction(this,this_03,&local_468);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_468);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_470,&local_438);
      add_instruction(this,this_03,&local_470);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_470);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&load_op,&local_448);
      add_instruction(this,this_03,&load_op);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&load_op);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_448);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_438);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_428);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_418);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_408);
    }
    if ((call_id._7_1_ & 1) == 0) {
      local_49c = 0xe0;
      std::make_unique<spv::Instruction,spv::Op>((Op *)&local_498);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_498);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_498);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,2,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_498);
      MVar2 = spv::operator|(MemorySemanticsAcquireReleaseMask,MemorySemanticsWorkgroupMemoryMask);
      IVar1 = spv::Builder::makeUintConstant(&this->builder,MVar2,false);
      spv::Instruction::addIdOperand(pIVar3,IVar1);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_4a8,&local_498);
      add_instruction(this,this_03,&local_4a8);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_4a8);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_498);
    }
    spv::Builder::makeReturn
              (&this->builder,false,
               counts_offsets._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    spv::Builder::setBuildPoint(&this->builder,entry);
    IVar1 = spv::Function::getId(local_58);
    *(Id *)&current_build_point->_vptr_Block = IVar1;
    this_local._4_4_ = spv::Function::getId(local_58);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_e0);
  }
  else {
    this_local._4_4_ = *(Id *)&local_4b8->_vptr_Block;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_allocate_node_records(SPIRVModule &, bool per_thread)
{
	auto &call_id = per_thread ? allocate_thread_node_records_call_id : allocate_group_node_records_call_id;
	if (call_id)
		return call_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uint64_type = builder.makeUintType(64);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type,
	                                       per_thread ? "AllocateThreadNodeRecords" : "AllocateGroupNodeRecords",
	                                       { uint64_type, uint_type, uint_type, uint_type, uint_type },
	                                       {}, &entry);

	builder.addName(func->getParamId(0), "AtomicCountersBDA");
	builder.addName(func->getParamId(1), "NodeMetadataIndex");
	builder.addName(func->getParamId(2), "Count");
	builder.addName(func->getParamId(3), "Stride");
	builder.addName(func->getParamId(4), "AllocationOffset");

	spv::Id total_count_id;
	spv::Id phi_undefined_id = 0;

	if (per_thread)
	{
		// Do this on a per-wave basis. The node metadata index can be divergent, and we need to consider
		// that the outer function is a waterfall loop.
		builder.addCapability(spv::CapabilityGroupNonUniformBallot);
		builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);

		auto counts_total =
		    std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformIAdd);
		counts_total->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		counts_total->addImmediateOperand(spv::GroupOperationReduce);
		counts_total->addIdOperand(func->getParamId(2));

		total_count_id = counts_total->getResultId();
		add_instruction(entry, std::move(counts_total));

		phi_undefined_id = builder.createUndefined(uint_type);
	}
	else
	{
		total_count_id = func->getParamId(2);
	}

	auto *return_block = new spv::Block(builder.getUniqueId(), *func);
	auto check_empty = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
	check_empty->addIdOperand(total_count_id);
	check_empty->addIdOperand(builder.makeUintConstant(0));
	spv::Id return_early_cond_id = check_empty->getResultId();
	add_instruction(entry, std::move(check_empty));

	auto *reconverge_block = new spv::Block(builder.getUniqueId(), *func);
	builder.setBuildPoint(entry);
	builder.createSelectionMerge(reconverge_block, 0);
	builder.createConditionalBranch(return_early_cond_id, return_block, reconverge_block);
	builder.setBuildPoint(return_block);
	builder.makeReturn(false, builder.makeUintConstant(0));

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);

	spv::Id shared_id = 0;
	if (!per_thread)
		shared_id = create_variable(spv::StorageClassWorkgroup, uint_type, "AllocateGroupNodeRecordsShared");

	spv::Id is_first_lane_id;

	if (per_thread)
	{
		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
		is_first_lane->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		is_first_lane_id = is_first_lane->getResultId();
		add_instruction(reconverge_block, std::move(is_first_lane));
	}
	else
	{
		spv::Id local_invocation_index = get_builtin_shader_input(spv::BuiltInLocalInvocationIndex);
		auto load_local_index = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_local_index->addIdOperand(local_invocation_index);

		auto is_first_lane = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpIEqual);
		is_first_lane->addIdOperand(load_local_index->getResultId());
		is_first_lane->addIdOperand(builder.makeUintConstant(0));
		is_first_lane_id = is_first_lane->getResultId();
		add_instruction(reconverge_block, std::move(load_local_index));
		add_instruction(reconverge_block, std::move(is_first_lane));
	}

	builder.setBuildPoint(reconverge_block);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(is_first_lane_id, body_block, merge_block);

	spv::Id payload_offset_id;
	builder.setBuildPoint(body_block);
	{
		// Compute required payload bytes to allocate, and align.
		auto mul_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		mul_op->addIdOperand(total_count_id);
		mul_op->addIdOperand(func->getParamId(3));

		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(mul_op->getResultId());
		add_op->addIdOperand(builder.makeUintConstant(15));

		auto and_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseAnd);
		and_op->addIdOperand(add_op->getResultId());
		and_op->addIdOperand(builder.makeUintConstant(~15u));

		spv::Id uint_array_type = builder.makeRuntimeArray(uint_type);
		builder.addDecoration(uint_array_type, spv::DecorationArrayStride, 4);
		spv::Id struct_type_id = builder.makeStructType({ uint_type, uint_type, uint_array_type }, "NodeAtomics");
		builder.addDecoration(struct_type_id, spv::DecorationBlock);
		builder.addMemberName(struct_type_id, 0, "payloadCount");
		builder.addMemberName(struct_type_id, 1, "fusedCount");
		builder.addMemberName(struct_type_id, 2, "perNodeTotal");
		builder.addMemberDecoration(struct_type_id, 0, spv::DecorationOffset, 0);
		builder.addMemberDecoration(struct_type_id, 1, spv::DecorationOffset, 4);
		builder.addMemberDecoration(struct_type_id, 2, spv::DecorationOffset, 8);

		auto cast_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, struct_type_id),
		    spv::OpBitcast);
		cast_op->addIdOperand(func->getParamId(0));

		auto chain_payload_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_total_op->addIdOperand(cast_op->getResultId());
		chain_payload_total_op->addIdOperand(builder.makeUintConstant(0));

		auto chain_fused_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_fused_total_op->addIdOperand(cast_op->getResultId());
		chain_fused_total_op->addIdOperand(builder.makeUintConstant(1));

		auto payload_total_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		payload_total_atomic_op->addIdOperand(chain_payload_total_op->getResultId());
		payload_total_atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		payload_total_atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
		payload_total_atomic_op->addIdOperand(and_op->getResultId());

		spv::Id node_index = func->getParamId(1);

		auto chain_node_total_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_node_total_op->addIdOperand(cast_op->getResultId());
		chain_node_total_op->addIdOperand(builder.makeUintConstant(2));
		chain_node_total_op->addIdOperand(node_index);

		auto atomic_total_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		atomic_total_op->addIdOperand(chain_node_total_op->getResultId());
		atomic_total_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_total_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.
		atomic_total_op->addIdOperand(total_count_id);

		auto shift_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpShiftLeftLogical);
		shift_op->addIdOperand(node_index);
		shift_op->addIdOperand(builder.makeUintConstant(8));

		auto count_minus_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpISub);
		count_minus_1->addIdOperand(total_count_id);
		count_minus_1->addIdOperand(builder.makeUintConstant(1));

		auto or_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpBitwiseOr);
		or_op->addIdOperand(shift_op->getResultId());
		or_op->addIdOperand(count_minus_1->getResultId());

		auto fused_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIIncrement);
		fused_atomic_op->addIdOperand(chain_fused_total_op->getResultId());
		fused_atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		fused_atomic_op->addIdOperand(builder.makeUintConstant(0)); // There is no implied sync.

		auto fused_mul2 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		fused_mul2->addIdOperand(builder.makeUintConstant(2));
		fused_mul2->addIdOperand(fused_atomic_op->getResultId());

		auto payload_add_atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		payload_add_atomic_op->addIdOperand(func->getParamId(4));
		payload_add_atomic_op->addIdOperand(fused_mul2->getResultId());

		auto payload_add_atomic_op_plus_1 = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		payload_add_atomic_op_plus_1->addIdOperand(payload_add_atomic_op->getResultId());
		payload_add_atomic_op_plus_1->addIdOperand(builder.makeUintConstant(1));

		auto chain_payload_op = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_op->addIdOperand(cast_op->getResultId());
		chain_payload_op->addIdOperand(builder.makeUintConstant(2));
		chain_payload_op->addIdOperand(payload_add_atomic_op->getResultId());

		auto store_payload_inst = std::make_unique<spv::Instruction>(spv::OpStore);
		store_payload_inst->addIdOperand(chain_payload_op->getResultId());
		store_payload_inst->addIdOperand(or_op->getResultId());
		store_payload_inst->addImmediateOperand(spv::MemoryAccessAlignedMask);
		store_payload_inst->addImmediateOperand(8);

		auto chain_payload_op_plus_1 = std::make_unique<spv::Instruction>(
		    builder.getUniqueId(),
		    builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type),
		    spv::OpInBoundsAccessChain);
		chain_payload_op_plus_1->addIdOperand(cast_op->getResultId());
		chain_payload_op_plus_1->addIdOperand(builder.makeUintConstant(2));
		chain_payload_op_plus_1->addIdOperand(payload_add_atomic_op_plus_1->getResultId());

		auto store_payload_inst_plus_1 = std::make_unique<spv::Instruction>(spv::OpStore);
		store_payload_inst_plus_1->addIdOperand(chain_payload_op_plus_1->getResultId());
		store_payload_inst_plus_1->addIdOperand(payload_total_atomic_op->getResultId());
		store_payload_inst_plus_1->addImmediateOperand(spv::MemoryAccessAlignedMask);
		store_payload_inst_plus_1->addImmediateOperand(4);

		payload_offset_id = payload_total_atomic_op->getResultId();

		add_instruction(body_block, std::move(mul_op));
		add_instruction(body_block, std::move(add_op));
		add_instruction(body_block, std::move(and_op));
		add_instruction(body_block, std::move(cast_op));
		add_instruction(body_block, std::move(chain_payload_total_op));
		add_instruction(body_block, std::move(chain_fused_total_op));
		add_instruction(body_block, std::move(payload_total_atomic_op));
		add_instruction(body_block, std::move(chain_node_total_op));
		add_instruction(body_block, std::move(shift_op));
		add_instruction(body_block, std::move(count_minus_1));
		add_instruction(body_block, std::move(or_op));
		add_instruction(body_block, std::move(fused_atomic_op));
		add_instruction(body_block, std::move(fused_mul2));
		add_instruction(body_block, std::move(atomic_total_op));
		add_instruction(body_block, std::move(payload_add_atomic_op));
		add_instruction(body_block, std::move(payload_add_atomic_op_plus_1));
		add_instruction(body_block, std::move(chain_payload_op));
		add_instruction(body_block, std::move(store_payload_inst));
		add_instruction(body_block, std::move(chain_payload_op_plus_1));
		add_instruction(body_block, std::move(store_payload_inst_plus_1));

		if (!per_thread)
		{
			auto store_inst = std::make_unique<spv::Instruction>(spv::OpStore);
			store_inst->addIdOperand(shared_id);
			store_inst->addIdOperand(payload_offset_id);
			add_instruction(body_block, std::move(store_inst));
		}

		builder.createBranch(merge_block);
	}
	builder.setBuildPoint(merge_block);

	if (!per_thread)
	{
		auto barrier_op = std::make_unique<spv::Instruction>(spv::OpControlBarrier);
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(
		    builder.makeUintConstant(spv::MemorySemanticsAcquireReleaseMask | spv::MemorySemanticsWorkgroupMemoryMask));
		add_instruction(merge_block, std::move(barrier_op));
	}

	spv::Id return_value;

	if (per_thread)
	{
		auto counts_offsets =
		    std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformIAdd);
		counts_offsets->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		counts_offsets->addImmediateOperand(spv::GroupOperationExclusiveScan);
		counts_offsets->addIdOperand(func->getParamId(2));

		auto phi_node = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpPhi);
		phi_node->addIdOperand(payload_offset_id);
		phi_node->addIdOperand(body_block->getId());
		phi_node->addIdOperand(phi_undefined_id);
		phi_node->addIdOperand(reconverge_block->getId());

		auto broadcast_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_op->addIdOperand(phi_node->getResultId());

		auto mul_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIMul);
		mul_op->addIdOperand(counts_offsets->getResultId());
		mul_op->addIdOperand(func->getParamId(3));

		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(broadcast_op->getResultId());
		add_op->addIdOperand(mul_op->getResultId());

		return_value = add_op->getResultId();

		add_instruction(merge_block, std::move(phi_node));
		add_instruction(merge_block, std::move(broadcast_op));
		add_instruction(merge_block, std::move(counts_offsets));
		add_instruction(merge_block, std::move(mul_op));
		add_instruction(merge_block, std::move(add_op));
	}
	else
	{
		auto load_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpLoad);
		load_op->addIdOperand(shared_id);
		return_value = load_op->getResultId();
		add_instruction(merge_block, std::move(load_op));
	}

	if (!per_thread)
	{
		// Avoid WAR hazard for back-to-back allocations.
		auto barrier_op = std::make_unique<spv::Instruction>(spv::OpControlBarrier);
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeWorkgroup));
		barrier_op->addIdOperand(
		    builder.makeUintConstant(spv::MemorySemanticsAcquireReleaseMask | spv::MemorySemanticsWorkgroupMemoryMask));
		add_instruction(merge_block, std::move(barrier_op));
	}

	builder.makeReturn(false, return_value);
	builder.setBuildPoint(current_build_point);
	call_id = func->getId();
	return func->getId();
}